

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O1

int mg_session_read_begin_message(mg_session *session,mg_message_begin **message)

{
  int iVar1;
  mg_message_begin *pmVar2;
  mg_map *extra;
  mg_message_begin local_20;
  
  iVar1 = mg_session_read_map(session,&local_20.extra);
  if (iVar1 == 0) {
    pmVar2 = (mg_message_begin *)mg_allocator_malloc(session->decoder_allocator,8);
    if (pmVar2 == (mg_message_begin *)0x0) {
      iVar1 = -3;
    }
    else {
      pmVar2->extra = local_20.extra;
      *message = pmVar2;
      iVar1 = 0;
    }
    mg_map_destroy_ca(local_20.extra,session->decoder_allocator);
  }
  return iVar1;
}

Assistant:

int mg_session_read_begin_message(mg_session *session,
                                  mg_message_begin **message) {
  int status = 0;

  mg_map *extra;
  status = mg_session_read_map(session, &extra);
  if (status != 0) {
    return status;
  }

  mg_message_begin *tmessage =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_message_begin));
  if (!tmessage) {
    status = MG_ERROR_OOM;
    goto cleanup;
  }

  tmessage->extra = extra;
  *message = tmessage;

cleanup:
  mg_map_destroy_ca(extra, session->decoder_allocator);
  return status;
}